

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverAppTest_IgnoreFirstArgument_Test::~SolverAppTest_IgnoreFirstArgument_Test
          (SolverAppTest_IgnoreFirstArgument_Test *this)

{
  SolverAppTest::~SolverAppTest(&this->super_SolverAppTest);
  return;
}

Assistant:

TEST_F(SolverAppTest, IgnoreFirstArgument) {
  AddOption();
  RedirectOutput();
  EXPECT_EQ(0, app_.Run(Args("-w")));
}